

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomProperty::read(DomProperty *this,int __fd,void *__buf,size_t __nbytes)

{
  double dVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  DomColor *this_00;
  DomFont *this_01;
  DomResourceIcon *this_02;
  DomResourcePixmap *this_03;
  DomPalette *this_04;
  DomPoint *this_05;
  DomRect *this_06;
  DomLocale *this_07;
  DomSizePolicy *this_08;
  DomSize *this_09;
  DomString *this_10;
  DomStringList *this_11;
  DomDate *this_12;
  DomTime *this_13;
  DomDateTime *this_14;
  DomPointF *this_15;
  DomRectF *this_16;
  DomSizeF *this_17;
  qlonglong qVar5;
  DomChar *this_18;
  DomUrl *this_19;
  ulong uVar6;
  qulonglong qVar7;
  DomBrush *this_20;
  char16_t *pcVar8;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  void *__buf_15;
  void *__buf_16;
  void *__buf_17;
  void *__buf_18;
  void *__buf_19;
  void *__buf_20;
  undefined4 in_register_00000034;
  QString *pQVar9;
  QString *this_21;
  long lVar10;
  long in_FS_OFFSET;
  float fVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QStringView QVar24;
  QStringView QVar25;
  QStringView QVar26;
  QStringView QVar27;
  QStringView QVar28;
  QStringView QVar29;
  QStringView QVar30;
  QStringView QVar31;
  QStringView QVar32;
  QStringView QVar33;
  QStringView QVar34;
  QStringView QVar35;
  QStringView QVar36;
  QStringView QVar37;
  QStringView QVar38;
  QStringView QVar39;
  QStringView QVar40;
  QStringView QVar41;
  QStringView QVar42;
  QStringView QVar43;
  QStringView QVar44;
  QStringView QVar45;
  QStringView QVar46;
  QStringView QVar47;
  QStringView QVar48;
  QStringView QVar49;
  QStringView QVar50;
  QStringView QVar51;
  QStringView QVar52;
  QStringView QVar53;
  QStringView QVar54;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_98;
  QString local_80;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  pQVar9 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  if (local_50.size != 0) {
    lVar10 = 0;
    do {
      local_68.m_data = *(storage_type_conflict **)(local_50.ptr + lVar10 + 8);
      local_68.m_size = *(qsizetype *)(local_50.ptr + lVar10 + 0x10);
      if ((local_68.m_size == 4) &&
         (QVar12.m_data = local_68.m_data, QVar12.m_size = 4, QVar20.m_data = L"name",
         QVar20.m_size = 4, cVar2 = QtPrivate::equalStrings(QVar12,QVar20), cVar2 != '\0')) {
        QString::QString(&local_80,*(QChar **)(local_50.ptr + lVar10 + 0x50),
                         *(longlong *)(local_50.ptr + lVar10 + 0x58));
        QString::operator=(&this->m_attr_name,&local_80);
        this->m_has_attr_name = true;
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else if ((local_68.m_size == 6) &&
              (QVar13.m_data = local_68.m_data, QVar13.m_size = 6, QVar21.m_data = L"stdset",
              QVar21.m_size = 6, cVar2 = QtPrivate::equalStrings(QVar13,QVar21), cVar2 != '\0')) {
        QVar14.m_data = *(storage_type_conflict **)(local_50.ptr + lVar10 + 0x50);
        QVar14.m_size = *(qsizetype *)(local_50.ptr + lVar10 + 0x58);
        lVar4 = QString::toIntegral_helper(QVar14,(bool *)0x0,10);
        iVar3 = (int)lVar4;
        if (iVar3 != lVar4) {
          iVar3 = 0;
        }
        this->m_attr_stdset = iVar3;
        this->m_has_attr_stdset = true;
      }
      else {
        local_98.a.m_size = 0x15;
        local_98.a.m_data = "Unexpected attribute ";
        local_98.b = &local_68;
        QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>(&local_80,&local_98);
        QXmlStreamReader::raiseError(pQVar9);
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      lVar10 = lVar10 + 0x68;
    } while (local_50.size * 0x68 != lVar10);
  }
  iVar3 = QXmlStreamReader::error();
  if (iVar3 == 0) {
    do {
      iVar3 = QXmlStreamReader::readNext();
      if (iVar3 != 4) {
        if (iVar3 != 5) goto LAB_0015baac;
        break;
      }
      local_68.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_68.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
      local_68 = (QStringView)QXmlStreamReader::name();
      QVar22.m_data = L"bool";
      QVar22.m_size = 4;
      iVar3 = QtPrivate::compareStrings(local_68,QVar22,CaseInsensitive);
      if (iVar3 == 0) {
        QXmlStreamReader::readElementText(&local_80,pQVar9,0);
        clear(this);
        this->m_kind = Bool;
        this_21 = &this->m_bool;
        goto LAB_0015ba81;
      }
      QVar23.m_data = L"color";
      QVar23.m_size = 5;
      pcVar8 = L"color";
      iVar3 = QtPrivate::compareStrings(local_68,QVar23,CaseInsensitive);
      if (iVar3 == 0) {
        this_00 = (DomColor *)operator_new(0x18);
        this_00->m_attr_alpha = 0;
        this_00->m_has_attr_alpha = false;
        *(undefined3 *)&this_00->field_0x5 = 0;
        this_00->m_children = 0;
        this_00->m_red = 0;
        this_00->m_green = 0;
        this_00->m_blue = 0;
        DomColor::read(this_00,__fd,__buf_00,(size_t)pcVar8);
        clear(this);
        this->m_kind = Color;
        this->m_color = this_00;
        goto LAB_0015baac;
      }
      QVar24.m_data = L"cstring";
      QVar24.m_size = 7;
      iVar3 = QtPrivate::compareStrings(local_68,QVar24,CaseInsensitive);
      if (iVar3 == 0) {
        QXmlStreamReader::readElementText(&local_80,pQVar9,0);
        clear(this);
        this->m_kind = Cstring;
        this_21 = &this->m_cstring;
        goto LAB_0015ba81;
      }
      QVar25.m_data = L"cursor";
      QVar25.m_size = 6;
      iVar3 = QtPrivate::compareStrings(local_68,QVar25,CaseInsensitive);
      if (iVar3 == 0) {
        QXmlStreamReader::readElementText(&local_80,pQVar9,0);
        QVar15.m_data = local_80.d.ptr;
        QVar15.m_size = local_80.d.size;
        lVar10 = QString::toIntegral_helper(QVar15,(bool *)0x0,10);
        iVar3 = (int)lVar10;
        if (iVar3 != lVar10) {
          iVar3 = 0;
        }
        clear(this);
        this->m_kind = Cursor;
        this->m_cursor = iVar3;
        goto LAB_0015ba89;
      }
      QVar26.m_data = L"cursorshape";
      QVar26.m_size = 0xb;
      iVar3 = QtPrivate::compareStrings(local_68,QVar26,CaseInsensitive);
      if (iVar3 == 0) {
        QXmlStreamReader::readElementText(&local_80,pQVar9,0);
        clear(this);
        this->m_kind = CursorShape;
        this_21 = &this->m_cursorShape;
LAB_0015ba81:
        QString::operator=(this_21,&local_80);
LAB_0015ba89:
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else {
        QVar27.m_data = L"enum";
        QVar27.m_size = 4;
        iVar3 = QtPrivate::compareStrings(local_68,QVar27,CaseInsensitive);
        if (iVar3 == 0) {
          QXmlStreamReader::readElementText(&local_80,pQVar9,0);
          clear(this);
          this->m_kind = Enum;
          this_21 = &this->m_enum;
          goto LAB_0015ba81;
        }
        QVar28.m_data = L"font";
        QVar28.m_size = 4;
        pcVar8 = L"font";
        iVar3 = QtPrivate::compareStrings(local_68,QVar28,CaseInsensitive);
        if (iVar3 != 0) {
          QVar29.m_data = L"iconset";
          QVar29.m_size = 7;
          pcVar8 = L"iconset";
          iVar3 = QtPrivate::compareStrings(local_68,QVar29,CaseInsensitive);
          if (iVar3 == 0) {
            this_02 = (DomResourceIcon *)operator_new(0x98);
            memset(this_02,0,0x98);
            DomResourceIcon::read(this_02,__fd,__buf_02,(size_t)pcVar8);
            clear(this);
            this->m_kind = IconSet;
            this->m_iconSet = this_02;
            goto LAB_0015baac;
          }
          QVar30.m_data = L"pixmap";
          QVar30.m_size = 6;
          pcVar8 = L"pixmap";
          iVar3 = QtPrivate::compareStrings(local_68,QVar30,CaseInsensitive);
          if (iVar3 == 0) {
            this_03 = (DomResourcePixmap *)operator_new(0x58);
            (this_03->m_text).d.d = (Data *)0x0;
            (this_03->m_text).d.ptr = (char16_t *)0x0;
            (this_03->m_text).d.size = 0;
            (this_03->m_attr_resource).d.d = (Data *)0x0;
            (this_03->m_attr_resource).d.ptr = (char16_t *)0x0;
            (this_03->m_attr_resource).d.size = 0;
            *(undefined8 *)&this_03->m_has_attr_resource = 0;
            (this_03->m_attr_alias).d.d = (Data *)0x0;
            (this_03->m_attr_alias).d.ptr = (char16_t *)0x0;
            (this_03->m_attr_alias).d.size = 0;
            *(undefined8 *)&this_03->m_has_attr_alias = 0;
            DomResourcePixmap::read(this_03,__fd,__buf_03,(size_t)pcVar8);
            clear(this);
            this->m_kind = Pixmap;
            this->m_pixmap = this_03;
            goto LAB_0015baac;
          }
          QVar31.m_data = L"palette";
          QVar31.m_size = 7;
          pcVar8 = L"palette";
          iVar3 = QtPrivate::compareStrings(local_68,QVar31,CaseInsensitive);
          if (iVar3 == 0) {
            this_04 = (DomPalette *)operator_new(0x20);
            *(undefined8 *)this_04 = 0;
            this_04->m_active = (DomColorGroup *)0x0;
            this_04->m_inactive = (DomColorGroup *)0x0;
            this_04->m_disabled = (DomColorGroup *)0x0;
            DomPalette::read(this_04,__fd,__buf_04,(size_t)pcVar8);
            clear(this);
            this->m_kind = Palette;
            this->m_palette = this_04;
            goto LAB_0015baac;
          }
          QVar32.m_data = L"point";
          QVar32.m_size = 5;
          pcVar8 = L"point";
          iVar3 = QtPrivate::compareStrings(local_68,QVar32,CaseInsensitive);
          if (iVar3 == 0) {
            this_05 = (DomPoint *)operator_new(0xc);
            this_05->m_children = 0;
            this_05->m_x = 0;
            this_05->m_y = 0;
            DomPoint::read(this_05,__fd,__buf_05,(size_t)pcVar8);
            clear(this);
            this->m_kind = Point;
            this->m_point = this_05;
            goto LAB_0015baac;
          }
          QVar33.m_data = L"rect";
          QVar33.m_size = 4;
          pcVar8 = L"rect";
          iVar3 = QtPrivate::compareStrings(local_68,QVar33,CaseInsensitive);
          if (iVar3 == 0) {
            this_06 = (DomRect *)operator_new(0x14);
            this_06->m_children = 0;
            this_06->m_x = 0;
            this_06->m_y = 0;
            this_06->m_width = 0;
            this_06->m_height = 0;
            DomRect::read(this_06,__fd,__buf_06,(size_t)pcVar8);
            clear(this);
            this->m_kind = Rect;
            this->m_rect = this_06;
            goto LAB_0015baac;
          }
          QVar34.m_data = L"set";
          QVar34.m_size = 3;
          iVar3 = QtPrivate::compareStrings(local_68,QVar34,CaseInsensitive);
          if (iVar3 == 0) {
            QXmlStreamReader::readElementText(&local_80,pQVar9,0);
            clear(this);
            this->m_kind = Set;
            this_21 = &this->m_set;
            goto LAB_0015ba81;
          }
          QVar35.m_data = L"locale";
          QVar35.m_size = 6;
          pcVar8 = L"locale";
          iVar3 = QtPrivate::compareStrings(local_68,QVar35,CaseInsensitive);
          if (iVar3 == 0) {
            this_07 = (DomLocale *)operator_new(0x40);
            (this_07->m_attr_language).d.d = (Data *)0x0;
            (this_07->m_attr_language).d.ptr = (char16_t *)0x0;
            (this_07->m_attr_language).d.size = 0;
            *(undefined8 *)&this_07->m_has_attr_language = 0;
            (this_07->m_attr_country).d.d = (Data *)0x0;
            (this_07->m_attr_country).d.ptr = (char16_t *)0x0;
            (this_07->m_attr_country).d.size = 0;
            *(undefined8 *)&this_07->m_has_attr_country = 0;
            DomLocale::read(this_07,__fd,__buf_07,(size_t)pcVar8);
            clear(this);
            this->m_kind = Locale;
            this->m_locale = this_07;
            goto LAB_0015baac;
          }
          QVar36.m_data = L"sizepolicy";
          QVar36.m_size = 10;
          pcVar8 = L"sizepolicy";
          iVar3 = QtPrivate::compareStrings(local_68,QVar36,CaseInsensitive);
          if (iVar3 == 0) {
            this_08 = (DomSizePolicy *)operator_new(0x50);
            (this_08->m_attr_hSizeType).d.d = (Data *)0x0;
            (this_08->m_attr_hSizeType).d.ptr = (char16_t *)0x0;
            (this_08->m_attr_hSizeType).d.size = 0;
            *(undefined8 *)&this_08->m_has_attr_hSizeType = 0;
            (this_08->m_attr_vSizeType).d.d = (Data *)0x0;
            (this_08->m_attr_vSizeType).d.ptr = (char16_t *)0x0;
            (this_08->m_attr_vSizeType).d.size = 0;
            this_08->m_has_attr_vSizeType = false;
            *(undefined3 *)&this_08->field_0x39 = 0;
            this_08->m_children = 0;
            this_08->m_hSizeType = 0;
            this_08->m_vSizeType = 0;
            this_08->m_horStretch = 0;
            this_08->m_verStretch = 0;
            DomSizePolicy::read(this_08,__fd,__buf_08,(size_t)pcVar8);
            clear(this);
            this->m_kind = SizePolicy;
            this->m_sizePolicy = this_08;
            goto LAB_0015baac;
          }
          QVar37.m_data = L"size";
          QVar37.m_size = 4;
          pcVar8 = L"size";
          iVar3 = QtPrivate::compareStrings(local_68,QVar37,CaseInsensitive);
          if (iVar3 == 0) {
            this_09 = (DomSize *)operator_new(0xc);
            this_09->m_children = 0;
            this_09->m_width = 0;
            this_09->m_height = 0;
            DomSize::read(this_09,__fd,__buf_09,(size_t)pcVar8);
            clear(this);
            this->m_kind = Size;
            this->m_size = this_09;
            goto LAB_0015baac;
          }
          QVar38.m_data = L"string";
          QVar38.m_size = 6;
          pcVar8 = L"string";
          iVar3 = QtPrivate::compareStrings(local_68,QVar38,CaseInsensitive);
          if (iVar3 == 0) {
            this_10 = (DomString *)operator_new(0x98);
            memset(this_10,0,0x98);
            DomString::read(this_10,__fd,__buf_10,(size_t)pcVar8);
            clear(this);
            this->m_kind = String;
            this->m_string = this_10;
            goto LAB_0015baac;
          }
          QVar39.m_data = L"stringlist";
          QVar39.m_size = 10;
          pcVar8 = L"stringlist";
          iVar3 = QtPrivate::compareStrings(local_68,QVar39,CaseInsensitive);
          if (iVar3 == 0) {
            this_11 = (DomStringList *)operator_new(0x98);
            memset(this_11,0,0x98);
            DomStringList::read(this_11,__fd,__buf_11,(size_t)pcVar8);
            clear(this);
            this->m_kind = StringList;
            this->m_stringList = this_11;
            goto LAB_0015baac;
          }
          QVar40.m_data = L"number";
          QVar40.m_size = 6;
          iVar3 = QtPrivate::compareStrings(local_68,QVar40,CaseInsensitive);
          if (iVar3 == 0) {
            QXmlStreamReader::readElementText(&local_80,pQVar9,0);
            QVar16.m_data = local_80.d.ptr;
            QVar16.m_size = local_80.d.size;
            lVar10 = QString::toIntegral_helper(QVar16,(bool *)0x0,10);
            iVar3 = (int)lVar10;
            if (iVar3 != lVar10) {
              iVar3 = 0;
            }
            clear(this);
            this->m_kind = Number;
            this->m_number = iVar3;
          }
          else {
            QVar41.m_data = L"float";
            QVar41.m_size = 5;
            iVar3 = QtPrivate::compareStrings(local_68,QVar41,CaseInsensitive);
            if (iVar3 == 0) {
              QXmlStreamReader::readElementText(&local_80,pQVar9,0);
              fVar11 = (float)QString::toFloat((bool *)&local_80);
              clear(this);
              this->m_kind = Float;
              this->m_float = fVar11;
            }
            else {
              QVar42.m_data = L"double";
              QVar42.m_size = 6;
              iVar3 = QtPrivate::compareStrings(local_68,QVar42,CaseInsensitive);
              if (iVar3 != 0) {
                QVar43.m_data = L"date";
                QVar43.m_size = 4;
                pcVar8 = L"date";
                iVar3 = QtPrivate::compareStrings(local_68,QVar43,CaseInsensitive);
                if (iVar3 == 0) {
                  this_12 = (DomDate *)operator_new(0x10);
                  this_12->m_children = 0;
                  this_12->m_year = 0;
                  this_12->m_month = 0;
                  this_12->m_day = 0;
                  DomDate::read(this_12,__fd,__buf_12,(size_t)pcVar8);
                  clear(this);
                  this->m_kind = Date;
                  this->m_date = this_12;
                }
                else {
                  QVar44.m_data = L"time";
                  QVar44.m_size = 4;
                  pcVar8 = L"time";
                  iVar3 = QtPrivate::compareStrings(local_68,QVar44,CaseInsensitive);
                  if (iVar3 == 0) {
                    this_13 = (DomTime *)operator_new(0x10);
                    this_13->m_children = 0;
                    this_13->m_hour = 0;
                    this_13->m_minute = 0;
                    this_13->m_second = 0;
                    DomTime::read(this_13,__fd,__buf_13,(size_t)pcVar8);
                    clear(this);
                    this->m_kind = Time;
                    this->m_time = this_13;
                  }
                  else {
                    QVar45.m_data = L"datetime";
                    QVar45.m_size = 8;
                    pcVar8 = L"datetime";
                    iVar3 = QtPrivate::compareStrings(local_68,QVar45,CaseInsensitive);
                    if (iVar3 == 0) {
                      this_14 = (DomDateTime *)operator_new(0x1c);
                      this_14->m_children = 0;
                      this_14->m_hour = 0;
                      this_14->m_minute = 0;
                      this_14->m_second = 0;
                      this_14->m_second = 0;
                      this_14->m_year = 0;
                      this_14->m_month = 0;
                      this_14->m_day = 0;
                      DomDateTime::read(this_14,__fd,__buf_14,(size_t)pcVar8);
                      clear(this);
                      this->m_kind = DateTime;
                      this->m_dateTime = this_14;
                    }
                    else {
                      QVar46.m_data = L"pointf";
                      QVar46.m_size = 6;
                      pcVar8 = L"pointf";
                      iVar3 = QtPrivate::compareStrings(local_68,QVar46,CaseInsensitive);
                      if (iVar3 == 0) {
                        this_15 = (DomPointF *)operator_new(0x18);
                        *(undefined8 *)this_15 = 0;
                        this_15->m_x = 0.0;
                        this_15->m_y = 0.0;
                        DomPointF::read(this_15,__fd,__buf_15,(size_t)pcVar8);
                        clear(this);
                        this->m_kind = PointF;
                        this->m_pointF = this_15;
                      }
                      else {
                        QVar47.m_data = L"rectf";
                        QVar47.m_size = 5;
                        pcVar8 = L"rectf";
                        iVar3 = QtPrivate::compareStrings(local_68,QVar47,CaseInsensitive);
                        if (iVar3 == 0) {
                          this_16 = (DomRectF *)operator_new(0x28);
                          *(undefined8 *)this_16 = 0;
                          this_16->m_x = 0.0;
                          this_16->m_y = 0.0;
                          this_16->m_width = 0.0;
                          this_16->m_height = 0.0;
                          DomRectF::read(this_16,__fd,__buf_16,(size_t)pcVar8);
                          clear(this);
                          this->m_kind = RectF;
                          this->m_rectF = this_16;
                        }
                        else {
                          QVar48.m_data = L"sizef";
                          QVar48.m_size = 5;
                          pcVar8 = L"sizef";
                          iVar3 = QtPrivate::compareStrings(local_68,QVar48,CaseInsensitive);
                          if (iVar3 == 0) {
                            this_17 = (DomSizeF *)operator_new(0x18);
                            *(undefined8 *)this_17 = 0;
                            this_17->m_width = 0.0;
                            this_17->m_height = 0.0;
                            DomSizeF::read(this_17,__fd,__buf_17,(size_t)pcVar8);
                            clear(this);
                            this->m_kind = SizeF;
                            this->m_sizeF = this_17;
                          }
                          else {
                            QVar49.m_data = L"longlong";
                            QVar49.m_size = 8;
                            iVar3 = QtPrivate::compareStrings(local_68,QVar49,CaseInsensitive);
                            if (iVar3 == 0) {
                              QXmlStreamReader::readElementText(&local_80,pQVar9,0);
                              QVar17.m_data = local_80.d.ptr;
                              QVar17.m_size = local_80.d.size;
                              qVar5 = QString::toIntegral_helper(QVar17,(bool *)0x0,10);
                              clear(this);
                              this->m_kind = LongLong;
                              this->m_longLong = qVar5;
LAB_0015c0dc:
                              if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
                                LOCK();
                                ((local_80.d.d)->super_QArrayData).ref_._q_value.
                                super___atomic_base<int>._M_i =
                                     ((local_80.d.d)->super_QArrayData).ref_._q_value.
                                     super___atomic_base<int>._M_i + -1;
                                UNLOCK();
                                if (((local_80.d.d)->super_QArrayData).ref_._q_value.
                                    super___atomic_base<int>._M_i == 0) {
                                  QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
                                }
                              }
                            }
                            else {
                              QVar50.m_data = L"char";
                              QVar50.m_size = 4;
                              pcVar8 = L"char";
                              iVar3 = QtPrivate::compareStrings(local_68,QVar50,CaseInsensitive);
                              if (iVar3 == 0) {
                                this_18 = (DomChar *)operator_new(8);
                                this_18->m_children = 0;
                                this_18->m_unicode = 0;
                                DomChar::read(this_18,__fd,__buf_18,(size_t)pcVar8);
                                clear(this);
                                this->m_kind = Char;
                                this->m_char = this_18;
                              }
                              else {
                                QVar51.m_data = L"url";
                                QVar51.m_size = 3;
                                pcVar8 = L"url";
                                iVar3 = QtPrivate::compareStrings(local_68,QVar51,CaseInsensitive);
                                if (iVar3 != 0) {
                                  QVar52.m_data = L"uint";
                                  QVar52.m_size = 4;
                                  iVar3 = QtPrivate::compareStrings(local_68,QVar52,CaseInsensitive)
                                  ;
                                  if (iVar3 == 0) {
                                    QXmlStreamReader::readElementText(&local_80,pQVar9,0);
                                    QVar18.m_data = local_80.d.ptr;
                                    QVar18.m_size = local_80.d.size;
                                    uVar6 = QString::toIntegral_helper(QVar18,(bool *)0x0,10);
                                    if (0xffffffff < uVar6) {
                                      uVar6 = 0;
                                    }
                                    clear(this);
                                    this->m_kind = UInt;
                                    this->m_UInt = (uint)uVar6;
                                  }
                                  else {
                                    QVar53.m_data = L"ulonglong";
                                    QVar53.m_size = 9;
                                    iVar3 = QtPrivate::compareStrings
                                                      (local_68,QVar53,CaseInsensitive);
                                    if (iVar3 == 0) {
                                      QXmlStreamReader::readElementText(&local_80,pQVar9,0);
                                      QVar19.m_data = local_80.d.ptr;
                                      QVar19.m_size = local_80.d.size;
                                      qVar7 = QString::toIntegral_helper(QVar19,(bool *)0x0,10);
                                      clear(this);
                                      this->m_kind = ULongLong;
                                      this->m_uLongLong = qVar7;
                                    }
                                    else {
                                      QVar54.m_data = L"brush";
                                      QVar54.m_size = 5;
                                      pcVar8 = L"brush";
                                      iVar3 = QtPrivate::compareStrings
                                                        (local_68,QVar54,CaseInsensitive);
                                      if (iVar3 == 0) {
                                        this_20 = (DomBrush *)operator_new(0x38);
                                        (this_20->m_attr_brushStyle).d.d = (Data *)0x0;
                                        (this_20->m_attr_brushStyle).d.ptr = (char16_t *)0x0;
                                        (this_20->m_attr_brushStyle).d.size = 0;
                                        this_20->m_has_attr_brushStyle = false;
                                        *(undefined3 *)&this_20->field_0x19 = 0;
                                        this_20->m_kind = Unknown;
                                        this_20->m_color = (DomColor *)0x0;
                                        this_20->m_texture = (DomProperty *)0x0;
                                        this_20->m_gradient = (DomGradient *)0x0;
                                        DomBrush::read(this_20,__fd,__buf_20,(size_t)pcVar8);
                                        clear(this);
                                        this->m_kind = Brush;
                                        this->m_brush = this_20;
                                        goto LAB_0015baac;
                                      }
                                      local_98.a.m_size = 0x13;
                                      local_98.a.m_data = "Unexpected element ";
                                      local_98.b = &local_68;
                                      QStringBuilder<QLatin1String,_const_QStringView_&>::
                                      convertTo<QString>(&local_80,&local_98);
                                      QXmlStreamReader::raiseError(pQVar9);
                                    }
                                  }
                                  goto LAB_0015c0dc;
                                }
                                this_19 = (DomUrl *)operator_new(0x10);
                                *(undefined8 *)this_19 = 0;
                                this_19->m_string = (DomString *)0x0;
                                DomUrl::read(this_19,__fd,__buf_19,(size_t)pcVar8);
                                clear(this);
                                this->m_kind = Url;
                                this->m_url = this_19;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                goto LAB_0015baac;
              }
              QXmlStreamReader::readElementText(&local_80,pQVar9,0);
              dVar1 = (double)QString::toDouble((bool *)&local_80);
              clear(this);
              this->m_kind = Double;
              this->m_double = dVar1;
            }
          }
          goto LAB_0015ba89;
        }
        this_01 = (DomFont *)operator_new(0x80);
        *(undefined8 *)this_01 = 0;
        (this_01->m_family).d.d = (Data *)0x0;
        (this_01->m_family).d.ptr = (char16_t *)0x0;
        (this_01->m_family).d.size = 0;
        this_01->m_pointSize = 0;
        this_01->m_weight = 0;
        this_01->m_italic = false;
        this_01->m_bold = false;
        this_01->m_underline = false;
        this_01->m_strikeOut = false;
        this_01->m_antialiasing = false;
        *(undefined3 *)&this_01->field_0x2d = 0;
        (this_01->m_styleStrategy).d.d = (Data *)0x0;
        (this_01->m_styleStrategy).d.ptr = (char16_t *)0x0;
        (this_01->m_styleStrategy).d.size = 0;
        *(undefined8 *)&this_01->m_kerning = 0;
        (this_01->m_hintingPreference).d.d = (Data *)0x0;
        (this_01->m_hintingPreference).d.ptr = (char16_t *)0x0;
        (this_01->m_hintingPreference).d.size = 0;
        (this_01->m_fontWeight).d.d = (Data *)0x0;
        (this_01->m_fontWeight).d.ptr = (char16_t *)0x0;
        (this_01->m_fontWeight).d.size = 0;
        DomFont::read(this_01,__fd,__buf_01,(size_t)pcVar8);
        clear(this);
        this->m_kind = Font;
        this->m_font = this_01;
      }
LAB_0015baac:
      iVar3 = QXmlStreamReader::error();
    } while (iVar3 == 0);
  }
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomProperty::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"name"_s) {
            setAttributeName(attribute.value().toString());
            continue;
        }
        if (name == u"stdset"_s) {
            setAttributeStdset(attribute.value().toInt());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"bool"_s, Qt::CaseInsensitive)) {
                setElementBool(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"color"_s, Qt::CaseInsensitive)) {
                auto *v = new DomColor();
                v->read(reader);
                setElementColor(v);
                continue;
            }
            if (!tag.compare(u"cstring"_s, Qt::CaseInsensitive)) {
                setElementCstring(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"cursor"_s, Qt::CaseInsensitive)) {
                setElementCursor(reader.readElementText().toInt());
                continue;
            }
            if (!tag.compare(u"cursorshape"_s, Qt::CaseInsensitive)) {
                setElementCursorShape(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"enum"_s, Qt::CaseInsensitive)) {
                setElementEnum(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"font"_s, Qt::CaseInsensitive)) {
                auto *v = new DomFont();
                v->read(reader);
                setElementFont(v);
                continue;
            }
            if (!tag.compare(u"iconset"_s, Qt::CaseInsensitive)) {
                auto *v = new DomResourceIcon();
                v->read(reader);
                setElementIconSet(v);
                continue;
            }
            if (!tag.compare(u"pixmap"_s, Qt::CaseInsensitive)) {
                auto *v = new DomResourcePixmap();
                v->read(reader);
                setElementPixmap(v);
                continue;
            }
            if (!tag.compare(u"palette"_s, Qt::CaseInsensitive)) {
                auto *v = new DomPalette();
                v->read(reader);
                setElementPalette(v);
                continue;
            }
            if (!tag.compare(u"point"_s, Qt::CaseInsensitive)) {
                auto *v = new DomPoint();
                v->read(reader);
                setElementPoint(v);
                continue;
            }
            if (!tag.compare(u"rect"_s, Qt::CaseInsensitive)) {
                auto *v = new DomRect();
                v->read(reader);
                setElementRect(v);
                continue;
            }
            if (!tag.compare(u"set"_s, Qt::CaseInsensitive)) {
                setElementSet(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"locale"_s, Qt::CaseInsensitive)) {
                auto *v = new DomLocale();
                v->read(reader);
                setElementLocale(v);
                continue;
            }
            if (!tag.compare(u"sizepolicy"_s, Qt::CaseInsensitive)) {
                auto *v = new DomSizePolicy();
                v->read(reader);
                setElementSizePolicy(v);
                continue;
            }
            if (!tag.compare(u"size"_s, Qt::CaseInsensitive)) {
                auto *v = new DomSize();
                v->read(reader);
                setElementSize(v);
                continue;
            }
            if (!tag.compare(u"string"_s, Qt::CaseInsensitive)) {
                auto *v = new DomString();
                v->read(reader);
                setElementString(v);
                continue;
            }
            if (!tag.compare(u"stringlist"_s, Qt::CaseInsensitive)) {
                auto *v = new DomStringList();
                v->read(reader);
                setElementStringList(v);
                continue;
            }
            if (!tag.compare(u"number"_s, Qt::CaseInsensitive)) {
                setElementNumber(reader.readElementText().toInt());
                continue;
            }
            if (!tag.compare(u"float"_s, Qt::CaseInsensitive)) {
                setElementFloat(reader.readElementText().toFloat());
                continue;
            }
            if (!tag.compare(u"double"_s, Qt::CaseInsensitive)) {
                setElementDouble(reader.readElementText().toDouble());
                continue;
            }
            if (!tag.compare(u"date"_s, Qt::CaseInsensitive)) {
                auto *v = new DomDate();
                v->read(reader);
                setElementDate(v);
                continue;
            }
            if (!tag.compare(u"time"_s, Qt::CaseInsensitive)) {
                auto *v = new DomTime();
                v->read(reader);
                setElementTime(v);
                continue;
            }
            if (!tag.compare(u"datetime"_s, Qt::CaseInsensitive)) {
                auto *v = new DomDateTime();
                v->read(reader);
                setElementDateTime(v);
                continue;
            }
            if (!tag.compare(u"pointf"_s, Qt::CaseInsensitive)) {
                auto *v = new DomPointF();
                v->read(reader);
                setElementPointF(v);
                continue;
            }
            if (!tag.compare(u"rectf"_s, Qt::CaseInsensitive)) {
                auto *v = new DomRectF();
                v->read(reader);
                setElementRectF(v);
                continue;
            }
            if (!tag.compare(u"sizef"_s, Qt::CaseInsensitive)) {
                auto *v = new DomSizeF();
                v->read(reader);
                setElementSizeF(v);
                continue;
            }
            if (!tag.compare(u"longlong"_s, Qt::CaseInsensitive)) {
                setElementLongLong(reader.readElementText().toLongLong());
                continue;
            }
            if (!tag.compare(u"char"_s, Qt::CaseInsensitive)) {
                auto *v = new DomChar();
                v->read(reader);
                setElementChar(v);
                continue;
            }
            if (!tag.compare(u"url"_s, Qt::CaseInsensitive)) {
                auto *v = new DomUrl();
                v->read(reader);
                setElementUrl(v);
                continue;
            }
            if (!tag.compare(u"uint"_s, Qt::CaseInsensitive)) {
                setElementUInt(reader.readElementText().toUInt());
                continue;
            }
            if (!tag.compare(u"ulonglong"_s, Qt::CaseInsensitive)) {
                setElementULongLong(reader.readElementText().toULongLong());
                continue;
            }
            if (!tag.compare(u"brush"_s, Qt::CaseInsensitive)) {
                auto *v = new DomBrush();
                v->read(reader);
                setElementBrush(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}